

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiOldColumns *columns_00;
  ImGuiOldColumnData *pIVar1;
  int in_EDI;
  float in_XMM0_Da;
  float rhs;
  float fVar2;
  float width;
  bool preserve_width;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint3 in_stack_ffffffffffffffd4;
  uint uVar3;
  ImGuiContext *pIVar4;
  float local_8;
  int local_4;
  
  columns_00 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (columns_00 == (ImGuiOldColumns *)0x0) {
    __assert_fail("columns != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xe32,"void ImGui::SetColumnOffset(int, float)");
  }
  local_4 = in_EDI;
  if (in_EDI < 0) {
    local_4 = columns_00->Current;
  }
  if (local_4 < (columns_00->Columns).Size) {
    uVar3 = (uint)in_stack_ffffffffffffffd4;
    if ((columns_00->Flags & 4U) == 0) {
      uVar3 = CONCAT13(local_4 < columns_00->Count + -1,in_stack_ffffffffffffffd4);
    }
    pIVar4 = GImGui;
    if ((char)(uVar3 >> 0x18) == '\0') {
      rhs = 0.0;
    }
    else {
      rhs = GetColumnWidthEx((ImGuiOldColumns *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc,
                             SUB41((uint)in_stack_ffffffffffffffc8 >> 0x18,0));
    }
    local_8 = in_XMM0_Da;
    if ((columns_00->Flags & 8U) == 0) {
      local_8 = ImMin<float>(in_XMM0_Da,
                             -(pIVar4->Style).ColumnsMinSpacing *
                             (float)(columns_00->Count - local_4) + columns_00->OffMaxX);
    }
    fVar2 = GetColumnNormFromOffset(columns_00,local_8 - columns_00->OffMinX);
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[]
                       ((ImVector<ImGuiOldColumnData> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
    pIVar1->OffsetNorm = fVar2;
    if ((uVar3 & 0x1000000) != 0) {
      ImMax<float>((pIVar4->Style).ColumnsMinSpacing,rhs);
      SetColumnOffset((int)((ulong)pIVar4 >> 0x20),SUB84(pIVar4,0));
    }
    return;
  }
  __assert_fail("column_index < columns->Columns.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                ,0xe36,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}